

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.h
# Opt level: O0

void set_offsets_for_motion_search
               (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  int num_planes_00;
  uint bw;
  uint bh;
  int in_ECX;
  int in_EDX;
  YV12_BUFFER_CONFIG *in_RSI;
  MACROBLOCK *in_RDI;
  undefined1 in_R8B;
  BLOCK_SIZE unaff_retaddr;
  macroblockd_plane *in_stack_00000008;
  int mi_height;
  int mi_width;
  MACROBLOCKD *xd;
  int num_planes;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  MACROBLOCK *x_00;
  undefined4 in_stack_ffffffffffffffc8;
  CommonModeInfoParams *mi_params_00;
  BLOCK_SIZE in_stack_ffffffffffffffe3;
  undefined3 in_stack_ffffffffffffffe4;
  int num_planes_01;
  byte bVar1;
  
  num_planes_01 = CONCAT13(in_R8B,in_stack_ffffffffffffffe4);
  mi_params_00 = (CommonModeInfoParams *)(in_RDI[1].picked_ref_frames_mask + 0x236);
  num_planes_00 = av1_num_planes((AV1_COMMON *)(in_RDI[1].picked_ref_frames_mask + 0x1b4));
  x_00 = (MACROBLOCK *)(in_RSI + 2);
  bVar1 = (byte)((uint)num_planes_01 >> 0x18);
  bw = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bVar1];
  bh = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bVar1];
  set_mode_info_offsets
            (mi_params_00,
             (MBMIExtFrameBufferInfo *)CONCAT44(num_planes_00,in_stack_ffffffffffffffc8),x_00,
             (MACROBLOCKD *)
             (ulong)CONCAT14("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [bVar1],bh),in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  av1_setup_dst_planes
            (in_stack_00000008,unaff_retaddr,(YV12_BUFFER_CONFIG *)in_RDI,
             (int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_EDX,(int)cm);
  av1_set_mv_limits((CommonModeInfoParams *)x_00,(FullMvLimits *)CONCAT44(bw,bh),
                    in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                    *(int *)((long)in_RDI[1].comp_rd_stats[0x10].dist + 0x14),(int)mi_params_00);
  set_plane_n4((MACROBLOCKD *)x_00,bw,bh,num_planes_00);
  *(int *)&x_00->plane[0].src_diff = in_EDX;
  *(int *)((long)&x_00->plane[0].src_diff + 4) = in_ECX;
  *(int *)((long)(x_00->e_mbd).plane[2].seg_qmatrix[5] + 0x84) = in_EDX * -0x20;
  *(uint *)((x_00->e_mbd).plane[2].seg_qmatrix[5] + 0x11) =
       ((mi_params_00->mi_rows - bh) - in_EDX) * 0x20;
  *(int *)((long)(x_00->e_mbd).plane[2].seg_qmatrix[5] + 0x7c) = in_ECX * -0x20;
  *(uint *)((x_00->e_mbd).plane[2].seg_qmatrix[5] + 0x10) =
       ((mi_params_00->mi_cols - bw) - in_ECX) * 0x20;
  av1_setup_src_planes(in_RDI,in_RSI,in_EDX,in_ECX,num_planes_01,in_stack_ffffffffffffffe3);
  return;
}

Assistant:

static inline void set_offsets_for_motion_search(const AV1_COMP *const cpi,
                                                 MACROBLOCK *const x,
                                                 int mi_row, int mi_col,
                                                 BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  const int mi_width = mi_size_wide[bsize];
  const int mi_height = mi_size_high[bsize];

  set_mode_info_offsets(&cpi->common.mi_params, &cpi->mbmi_ext_info, x, xd,
                        mi_row, mi_col);

  // Set up destination pointers.
  av1_setup_dst_planes(xd->plane, bsize, &cm->cur_frame->buf, mi_row, mi_col, 0,
                       num_planes);

  // Set up limit values for MV components.
  // Mv beyond the range do not produce new/different prediction block.
  av1_set_mv_limits(mi_params, &x->mv_limits, mi_row, mi_col, mi_height,
                    mi_width, cpi->oxcf.border_in_pixels);

  set_plane_n4(xd, mi_width, mi_height, num_planes);

  xd->mi_row = mi_row;
  xd->mi_col = mi_col;

  // Set up distance of MB to edge of frame in 1/8th pel units.
  assert(!(mi_col & (mi_width - 1)) && !(mi_row & (mi_height - 1)));
  xd->mb_to_top_edge = -GET_MV_SUBPEL(mi_row * MI_SIZE);
  xd->mb_to_bottom_edge =
      GET_MV_SUBPEL((mi_params->mi_rows - mi_height - mi_row) * MI_SIZE);
  xd->mb_to_left_edge = -GET_MV_SUBPEL(mi_col * MI_SIZE);
  xd->mb_to_right_edge =
      GET_MV_SUBPEL((mi_params->mi_cols - mi_width - mi_col) * MI_SIZE);

  // Set up source buffers.
  av1_setup_src_planes(x, cpi->source, mi_row, mi_col, num_planes, bsize);
}